

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_cipher_context_t * ptls_cipher_new(ptls_cipher_algorithm_t *algo,int is_enc,void *key)

{
  int iVar1;
  ptls_cipher_algorithm_t *ppVar2;
  ptls_cipher_algorithm_t *local_50;
  _func_void_st_ptls_cipher_context_t_ptr *local_48;
  _func_void_st_ptls_cipher_context_t_ptr_void_ptr *local_40;
  _func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *local_38;
  ptls_cipher_algorithm_t *local_30;
  ptls_cipher_context_t *ctx;
  void *key_local;
  ptls_cipher_algorithm_t *ppStack_18;
  int is_enc_local;
  ptls_cipher_algorithm_t *algo_local;
  
  ctx = (ptls_cipher_context_t *)key;
  key_local._4_4_ = is_enc;
  ppStack_18 = algo;
  ppVar2 = (ptls_cipher_algorithm_t *)malloc(algo->context_size);
  if (ppVar2 == (ptls_cipher_algorithm_t *)0x0) {
    algo_local = (ptls_cipher_algorithm_t *)0x0;
  }
  else {
    local_30 = ppVar2;
    memset(&local_50,0,0x20);
    local_50 = ppStack_18;
    ppVar2->name = (char *)ppStack_18;
    ppVar2->key_size = (size_t)local_48;
    ppVar2->block_size = (size_t)local_40;
    ppVar2->iv_size = (size_t)local_38;
    iVar1 = (*ppStack_18->setup_crypto)((ptls_cipher_context_t *)local_30,key_local._4_4_,ctx);
    if (iVar1 != 0) {
      free(local_30);
      local_30 = (ptls_cipher_algorithm_t *)0x0;
    }
    algo_local = local_30;
  }
  return (ptls_cipher_context_t *)algo_local;
}

Assistant:

ptls_cipher_context_t *ptls_cipher_new(ptls_cipher_algorithm_t *algo, int is_enc, const void *key)
{
    ptls_cipher_context_t *ctx;

    if ((ctx = (ptls_cipher_context_t *)malloc(algo->context_size)) == NULL)
        return NULL;
    *ctx = (ptls_cipher_context_t){algo};
    if (algo->setup_crypto(ctx, is_enc, key) != 0) {
        free(ctx);
        ctx = NULL;
    }
    return ctx;
}